

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O0

void __thiscall xe::ri::Section::~Section(Section *this)

{
  Section *this_local;
  
  (this->super_Item)._vptr_Item = (_func_int **)&PTR__Section_0013d868;
  List::~List(&this->items);
  std::__cxx11::string::~string((string *)&this->description);
  std::__cxx11::string::~string((string *)&this->name);
  Item::~Item(&this->super_Item);
  return;
}

Assistant:

~Section		(void) {}